

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::create_pipeline
          (DeconvolutionDepthWise_x86_fma *this,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  byte *in_RSI;
  long in_RDI;
  Mat weight_data_r2_1;
  Mat weight_data_r2;
  int k;
  int i;
  float *p;
  float *pt;
  Mat weight_data_transposed;
  int elempack;
  int channels;
  int maxk;
  Allocator *in_stack_fffffffffffffd08;
  size_t in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  Mat *in_stack_fffffffffffffd20;
  Option *in_stack_fffffffffffffd28;
  void **ppvVar5;
  int in_stack_fffffffffffffd34;
  Mat *in_stack_fffffffffffffd38;
  Mat *in_stack_fffffffffffffd40;
  int local_290;
  void *local_280;
  int *local_278;
  Allocator *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  Mat *in_stack_fffffffffffffda8;
  void *local_238;
  int *local_230;
  undefined8 local_228;
  undefined4 local_220;
  long *local_218;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 local_200;
  undefined8 local_1f8;
  int local_1f0;
  int local_1ec;
  long local_1e8;
  void *local_1d0;
  void *local_1c8;
  int *local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  long *local_1a8;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined8 local_188;
  int local_17c;
  int local_178;
  int local_174;
  byte *local_170;
  int local_15c;
  undefined8 local_158;
  undefined8 local_150;
  undefined4 local_144;
  void **local_140;
  void **local_138;
  long *local_130;
  void **local_128;
  void **local_118;
  void **local_108;
  int local_f8;
  undefined4 local_f4;
  void **local_f0;
  void **local_e8;
  void **local_e0;
  int local_d8;
  undefined4 local_d4;
  void **local_d0;
  int local_b8;
  undefined4 local_b4;
  void **local_b0;
  int local_98;
  undefined4 local_94;
  void **local_90;
  int local_78;
  undefined4 local_74;
  void **local_70;
  int local_68;
  undefined4 local_64;
  undefined8 *local_60;
  int local_58;
  undefined4 local_54;
  undefined8 *local_50;
  void *local_48;
  void *local_40;
  void *local_18;
  void *local_8;
  
  if (*(int *)(in_RDI + 0x168) == 0) {
    local_174 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
    uVar2 = (long)*(int *)(in_RDI + 0x110) / (long)*(int *)(in_RDI + 0x114);
    local_178 = ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                      (long)local_174) / (*(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x114))) *
                *(int *)(in_RDI + 0x114);
    local_170 = in_RSI;
    if ((local_178 == *(int *)(in_RDI + 0x114)) &&
       (*(int *)(in_RDI + 0x114) == *(int *)(in_RDI + 0xd0))) {
      local_17c = 1;
      if ((in_RSI[0x27] & 1) != 0) {
        if (local_178 % 8 == 0) {
          local_290 = 8;
        }
        else {
          local_290 = 1;
          if (local_178 % 4 == 0) {
            local_290 = 4;
          }
        }
        local_17c = local_290;
      }
      local_144 = *(undefined4 *)(in_RDI + 0x19c);
      local_140 = &local_1c8;
      local_150 = 4;
      local_158 = 0;
      local_1c8 = (void *)0x0;
      local_1c0 = (int *)0x0;
      local_1b8 = 0;
      local_1b0 = 0;
      local_1a8 = (long *)0x0;
      local_1a0 = 0;
      local_19c = 0;
      local_198 = 0;
      local_194 = 0;
      local_190 = 0;
      local_188 = 0;
      Mat::create(in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                  in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      local_138 = &local_1c8;
      local_1d0 = local_1c8;
      local_130 = (long *)(in_RDI + 0x170);
      local_1e8 = *local_130;
      for (local_1ec = 0;
          local_1ec <
          (local_178 / *(int *)(in_RDI + 0x114)) *
          (*(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x114)) * *(int *)(in_RDI + 0x114);
          local_1ec = local_1ec + 1) {
        for (local_1f0 = 0; local_1f0 < local_174; local_1f0 = local_1f0 + 1) {
          *(undefined4 *)((long)local_1d0 + (long)((local_174 + -1) - local_1f0) * 4) =
               *(undefined4 *)(local_1e8 + (long)local_1f0 * 4);
        }
        local_1e8 = local_1e8 + (long)local_174 * 4;
        local_1d0 = (void *)((long)local_1d0 + (long)local_174 * 4);
      }
      if (local_17c == 8) {
        Mat::reshape(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,
                     in_stack_fffffffffffffd98);
        convert_packing(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        in_stack_fffffffffffffd34,in_stack_fffffffffffffd28);
        local_128 = &local_238;
        local_70 = local_128;
        if (local_230 != (int *)0x0) {
          local_74 = 0xffffffff;
          LOCK();
          local_78 = *local_230;
          *local_230 = *local_230 + -1;
          UNLOCK();
          if (local_78 == 1) {
            if (local_218 == (long *)0x0) {
              if (local_238 != (void *)0x0) {
                free(local_238);
              }
            }
            else {
              (**(code **)(*local_218 + 0x18))(local_218,local_238);
            }
          }
        }
        local_238 = (void *)0x0;
        local_228 = 0;
        local_220 = 0;
        local_210 = 0;
        local_20c = 0;
        local_208 = 0;
        local_204 = 0;
        local_200 = 0;
        local_1f8 = 0;
        local_230 = (int *)0x0;
      }
      if (local_17c == 4) {
        Mat::reshape(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,
                     in_stack_fffffffffffffd98);
        convert_packing(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        in_stack_fffffffffffffd34,in_stack_fffffffffffffd28);
        ppvVar3 = &local_280;
        local_118 = ppvVar3;
        local_90 = ppvVar3;
        if (local_278 != (int *)0x0) {
          local_94 = 0xffffffff;
          LOCK();
          local_98 = *local_278;
          *local_278 = *local_278 + -1;
          UNLOCK();
          if (local_98 == 1) {
            if (CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0) == 0) {
              if (local_280 != (void *)0x0) {
                free(local_280);
              }
            }
            else {
              (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0) +
                          0x18))((long *)CONCAT44(in_stack_fffffffffffffda4,
                                                  in_stack_fffffffffffffda0),local_280);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
      }
      if (local_17c == 1) {
        ppvVar3 = (void **)(in_RDI + 0x218);
        local_f0 = &local_1c8;
        local_e8 = ppvVar3;
        local_e0 = ppvVar3;
        if (ppvVar3 != local_f0) {
          if (local_1c0 != (int *)0x0) {
            local_f4 = 1;
            LOCK();
            local_f8 = *local_1c0;
            *local_1c0 = *local_1c0 + 1;
            UNLOCK();
          }
          ppvVar5 = ppvVar3;
          local_d0 = ppvVar3;
          if (*(long *)(in_RDI + 0x220) != 0) {
            piVar1 = *(int **)(in_RDI + 0x220);
            local_d4 = 0xffffffff;
            LOCK();
            local_d8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_d8 == 1) {
              if (*(long *)(in_RDI + 0x238) == 0) {
                local_8 = *ppvVar3;
                if (local_8 != (void *)0x0) {
                  free(local_8);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x238) + 0x18))
                          (*(long **)(in_RDI + 0x238),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          *ppvVar5 = *local_f0;
          ppvVar5[1] = local_f0[1];
          ppvVar5[2] = local_f0[2];
          *(undefined4 *)(ppvVar5 + 3) = *(undefined4 *)(local_f0 + 3);
          ppvVar5[4] = local_f0[4];
          *(undefined4 *)(ppvVar5 + 5) = *(undefined4 *)(local_f0 + 5);
          *(undefined4 *)((long)ppvVar5 + 0x2c) = *(undefined4 *)((long)local_f0 + 0x2c);
          *(undefined4 *)(ppvVar5 + 6) = *(undefined4 *)(local_f0 + 6);
          *(undefined4 *)((long)ppvVar5 + 0x34) = *(undefined4 *)((long)local_f0 + 0x34);
          *(undefined4 *)(ppvVar5 + 7) = *(undefined4 *)(local_f0 + 7);
          ppvVar5[8] = local_f0[8];
          local_e0 = ppvVar5;
        }
      }
      if ((*local_170 & 1) != 0) {
        puVar4 = (undefined8 *)(in_RDI + 0x170);
        local_50 = puVar4;
        if (*(long *)(in_RDI + 0x178) != 0) {
          piVar1 = *(int **)(in_RDI + 0x178);
          local_54 = 0xffffffff;
          LOCK();
          local_58 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_58 == 1) {
            if (*(long *)(in_RDI + 400) == 0) {
              local_48 = (void *)*puVar4;
              if (local_48 != (void *)0x0) {
                free(local_48);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*puVar4);
            }
          }
        }
        *puVar4 = 0;
        puVar4[2] = 0;
        *(undefined4 *)(puVar4 + 3) = 0;
        *(undefined4 *)(puVar4 + 5) = 0;
        *(undefined4 *)((long)puVar4 + 0x2c) = 0;
        *(undefined4 *)(puVar4 + 6) = 0;
        *(undefined4 *)((long)puVar4 + 0x34) = 0;
        *(undefined4 *)(puVar4 + 7) = 0;
        puVar4[8] = 0;
        puVar4[1] = 0;
      }
      local_15c = 0;
      ppvVar3 = &local_1c8;
      if (local_1c0 != (int *)0x0) {
        local_b4 = 0xffffffff;
        LOCK();
        local_b8 = *local_1c0;
        *local_1c0 = *local_1c0 + -1;
        UNLOCK();
        if (local_b8 == 1) {
          local_108 = ppvVar3;
          local_b0 = ppvVar3;
          if (local_1a8 == (long *)0x0) {
            local_18 = local_1c8;
            if (local_1c8 != (void *)0x0) {
              free(local_1c8);
            }
          }
          else {
            (**(code **)(*local_1a8 + 0x18))(local_1a8,local_1c8);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      ppvVar3[2] = (void *)0x0;
      *(undefined4 *)(ppvVar3 + 3) = 0;
      *(undefined4 *)(ppvVar3 + 5) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
      *(undefined4 *)(ppvVar3 + 6) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
      *(undefined4 *)(ppvVar3 + 7) = 0;
      ppvVar3[8] = (void *)0x0;
      ppvVar3[1] = (void *)0x0;
    }
    else {
      create_group_ops((DeconvolutionDepthWise_x86_fma *)weight_data_r2._40_8_,
                       (Option *)weight_data_r2.allocator);
      if ((*local_170 & 1) != 0) {
        puVar4 = (undefined8 *)(in_RDI + 0x170);
        if (*(long *)(in_RDI + 0x178) != 0) {
          piVar1 = *(int **)(in_RDI + 0x178);
          local_64 = 0xffffffff;
          LOCK();
          local_68 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_68 == 1) {
            local_60 = puVar4;
            if (*(long *)(in_RDI + 400) == 0) {
              local_40 = (void *)*puVar4;
              if (local_40 != (void *)0x0) {
                free(local_40);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*puVar4);
            }
          }
        }
        *puVar4 = 0;
        *(undefined8 *)(in_RDI + 0x180) = 0;
        *(undefined4 *)(in_RDI + 0x188) = 0;
        *(undefined4 *)(in_RDI + 0x198) = 0;
        *(undefined4 *)(in_RDI + 0x19c) = 0;
        *(undefined4 *)(in_RDI + 0x1a0) = 0;
        *(undefined4 *)(in_RDI + 0x1a4) = 0;
        *(undefined4 *)(in_RDI + 0x1a8) = 0;
        *(undefined8 *)(in_RDI + 0x1b0) = 0;
        *(undefined8 *)(in_RDI + 0x178) = 0;
      }
      local_15c = 0;
    }
  }
  else {
    local_15c = 0;
  }
  return local_15c;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}